

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslationalOrderParamZ.cpp
# Opt level: O1

void __thiscall OpenMD::TranslationalOrderParamZ::processHistogram(TranslationalOrderParamZ *this)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  RealType RVar9;
  double dVar10;
  double dVar11;
  
  iVar1 = (this->super_RadialDistrFunc).nPairs_;
  RVar9 = Snapshot::getVolume(((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                              currentSnapshot_);
  if ((this->histogram_).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->histogram_).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      dVar11 = (double)uVar8 * this->deltaR_;
      dVar10 = pow(this->deltaR_ + dVar11,3.0);
      dVar11 = pow(dVar11,3.0);
      pvVar3 = (this->histogram_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)&pvVar3[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      lVar6 = (long)*(pointer *)
                     ((long)&pvVar3[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8) - lVar4;
      if (lVar6 != 0) {
        iVar2 = this->nZBins_;
        lVar5 = *(long *)&(this->avgGofr_).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar7 = 0;
        do {
          *(double *)(lVar5 + uVar7 * 8) =
               (double)*(int *)(lVar4 + uVar7 * 4) /
               (((((dVar10 - dVar11) * 12.566370614359172) / 3.0) * ((double)(iVar1 * 2) / RVar9)) /
               (double)iVar2) + *(double *)(lVar5 + uVar7 * 8);
          uVar7 = uVar7 + 1;
        } while ((uVar7 & 0xffffffff) < (ulong)(lVar6 >> 2));
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      uVar7 = ((long)(this->histogram_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->histogram_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
  }
  return;
}

Assistant:

void TranslationalOrderParamZ::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity = 2 * nPairs / volume;

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          4.0 * Constants::PI * (pow(rUpper, 3) - pow(rLower, 3)) / 3.0;
      RealType nIdeal = volSlice * pairDensity / nZBins_;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }